

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void text_client_argparse(t_text_client *x,int *argcp,t_atom **argvp,char *name)

{
  char *pcVar1;
  t_symbol *ptVar2;
  int iVar3;
  t_atom *ptVar4;
  
  iVar3 = *argcp;
  ptVar4 = *argvp;
  x->tc_sym = (t_symbol *)0x0;
  x->tc_struct = (t_symbol *)0x0;
  x->tc_field = (t_symbol *)0x0;
  gpointer_init(&x->tc_gp);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else if (ptVar4->a_type == A_SYMBOL) {
    pcVar1 = ((ptVar4->a_w).w_symbol)->s_name;
    if (((*pcVar1 == '-') && (pcVar1[1] == 's')) && (pcVar1[2] == '\0')) {
      if (((iVar3 < 3) || (ptVar4[1].a_type != A_SYMBOL)) || (ptVar4[2].a_type != A_SYMBOL)) {
        pd_error(x,"%s: \'-s\' needs a struct and field name",name);
      }
      else {
        ptVar2 = canvas_makebindsym(ptVar4[1].a_w.w_symbol);
        x->tc_struct = ptVar2;
        x->tc_field = (t_symbol *)ptVar4[2].a_w;
        iVar3 = iVar3 + -3;
        ptVar4 = ptVar4 + 3;
      }
    }
    else {
      x->tc_sym = (ptVar4->a_w).w_symbol;
      iVar3 = iVar3 + -1;
      ptVar4 = ptVar4 + 1;
    }
  }
  *argcp = iVar3;
  *argvp = ptVar4;
  return;
}

Assistant:

static void text_client_argparse(t_text_client *x, int *argcp, t_atom **argvp,
    char *name)
{
    int argc = *argcp;
    t_atom *argv = *argvp;
    x->tc_sym = x->tc_struct = x->tc_field = 0;
    gpointer_init(&x->tc_gp);
    if (argc && argv->a_type == A_SYMBOL &&
        !strcmp(argv->a_w.w_symbol->s_name, "-s"))
    {
        if (argc < 3 || argv[1].a_type != A_SYMBOL ||
            argv[2].a_type != A_SYMBOL)
                pd_error(x, "%s: '-s' needs a struct and field name", name);
        else
        {
            x->tc_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->tc_field = argv[2].a_w.w_symbol;
            argc -= 3; argv += 3;
        }
    }
    else if (argc && argv->a_type == A_SYMBOL)
    {
        x->tc_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    *argcp = argc;
    *argvp = argv;
}